

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

void __thiscall
chrono::ChFrameMoving<double>::TransformParentToLocal
          (ChFrameMoving<double> *this,ChFrameMoving<double> *parent,ChFrameMoving<double> *local)

{
  ChCoordsys<double> *parentpos;
  ChQuaternion<double> *other;
  ChQuaternion<double> *this_00;
  undefined8 uVar1;
  ChQuaternion<double> *this_01;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChQuaternion<double> local_f8;
  undefined1 local_d8 [32];
  ChQuaternion<double> local_b0;
  ChQuaternion<double> local_90;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  ChFrame<double>::TransformParentToLocal
            (&this->super_ChFrame<double>,&parent->super_ChFrame<double>,
             &local->super_ChFrame<double>);
  parentpos = &(parent->super_ChFrame<double>).coord;
  local_d8._0_8_ = parent;
  PointSpeedParentToLocal
            ((ChVector<double> *)&local_f8,this,&parentpos->pos,&(parent->coord_dt).pos);
  if ((ChCoordsys<double> *)&local_f8 != &local->coord_dt) {
    (local->coord_dt).pos.m_data[0] = local_f8.m_data[0];
    (local->coord_dt).pos.m_data[1] = local_f8.m_data[1];
    (local->coord_dt).pos.m_data[2] = local_f8.m_data[2];
  }
  PointAccelerationParentToLocal
            ((ChVector<double> *)&local_f8,this,&parentpos->pos,&(parent->coord_dt).pos,
             (ChVector<double> *)(local_d8._0_8_ + 0xc0));
  if ((ChCoordsys<double> *)&local_f8 != &local->coord_dtdt) {
    (local->coord_dtdt).pos.m_data[0] = local_f8.m_data[0];
    (local->coord_dtdt).pos.m_data[1] = local_f8.m_data[1];
    (local->coord_dtdt).pos.m_data[2] = local_f8.m_data[2];
  }
  local_70.m_data[0] = (this->super_ChFrame<double>).coord.rot.m_data[0];
  other = &(local->super_ChFrame<double>).coord.rot;
  this_00 = &(this->coord_dt).rot;
  auVar3._0_8_ = -(this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar3._8_4_ = 0;
  auVar3._12_4_ = 0x80000000;
  local_70.m_data[1]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 1);
  local_70.m_data[2]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 2);
  local_70.m_data[1]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0xc) ^ 0x80000000;
  local_70.m_data[2]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0x14) ^ 0x80000000;
  local_70.m_data[3] = (double)vmovlps_avx(auVar3);
  ChQuaternion<double>::operator%(&local_90,this_00,other);
  uVar1 = local_d8._0_8_;
  local_b0.m_data =
       (double  [4])vsubpd_avx(*(undefined1 (*) [32])(local_d8._0_8_ + 0xa0),local_90.m_data);
  ChQuaternion<double>::operator%(&local_f8,&local_70,&local_b0);
  this_01 = &(local->coord_dt).rot;
  ChQuaternion<double>::operator=(this_01,&local_f8);
  local_70.m_data[0] = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar4._0_8_ = -(this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar4._8_4_ = 0;
  auVar4._12_4_ = 0x80000000;
  local_70.m_data[1]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 1);
  local_70.m_data[2]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 2);
  local_70.m_data[1]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0xc) ^ 0x80000000;
  local_70.m_data[2]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0x14) ^ 0x80000000;
  local_70.m_data[3] = (double)vmovlps_avx(auVar4);
  ChQuaternion<double>::operator%(&local_90,&(this->coord_dtdt).rot,other);
  local_d8 = vsubpd_avx(*(undefined1 (*) [32])(uVar1 + 0xd8),(undefined1  [32])local_90.m_data);
  ChQuaternion<double>::operator%(&local_50,this_00,this_01);
  auVar2._0_8_ = local_50.m_data[0] + local_50.m_data[0];
  auVar2._8_8_ = local_50.m_data[1] + local_50.m_data[1];
  auVar2._16_8_ = local_50.m_data[2] + local_50.m_data[2];
  auVar2._24_8_ = local_50.m_data[3] + local_50.m_data[3];
  local_b0.m_data = (double  [4])vsubpd_avx(local_d8,auVar2);
  ChQuaternion<double>::operator%(&local_f8,&local_70,&local_b0);
  ChQuaternion<double>::operator=(&(local->coord_dtdt).rot,&local_f8);
  return;
}

Assistant:

void TransformParentToLocal(
        const ChFrameMoving<Real>& parent,  ///< frame to transform, given in parent coordinates
        ChFrameMoving<Real>& local          ///< transformed frame, in local coordinates, will be stored here
    ) const {
        // pos & rot
        ChFrame<Real>::TransformParentToLocal(parent, local);

        // pos_dt
        local.coord_dt.pos = PointSpeedParentToLocal(parent.coord.pos, parent.coord_dt.pos);

        // pos_dtdt
        local.coord_dtdt.pos =
            PointAccelerationParentToLocal(parent.coord.pos, parent.coord_dt.pos, parent.coord_dtdt.pos);

        // rot_dt
        local.coord_dt.rot = this->coord.rot.GetConjugate() % (parent.coord_dt.rot - coord_dt.rot % local.coord.rot);

        // rot_dtdt
        local.coord_dtdt.rot =
            this->coord.rot.GetConjugate() %
            (parent.coord_dtdt.rot - coord_dtdt.rot % local.coord.rot - (coord_dt.rot % local.coord_dt.rot) * 2);
    }